

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  ImGuiContext *pIVar1;
  float fVar2;
  int iVar3;
  int clip_dir;
  ImGuiContext *g;
  bool bVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  ImRect bb_rel;
  ImRect local_38;
  
  pIVar1 = GImGui;
  if (((((GImGui->NavWindow == window) && (GImGui->NavMoveRequest == true)) &&
       ((GImGui->NavMoveResultLocal).ID == 0)) &&
      (((GImGui->NavMoveResultOther).ID == 0 &&
       (GImGui->NavMoveRequestForward == ImGuiNavForward_None)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    if (move_flags == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x1fc0,
                    "void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *, ImGuiNavMoveFlags)");
    }
    local_38.Min = window->NavRectRel[0].Min;
    local_38.Max = window->NavRectRel[0].Max;
    iVar3 = GImGui->NavMoveDir;
    bVar4 = (move_flags & 5U) == 0;
    clip_dir = iVar3;
    if (iVar3 == 0) {
      if ((move_flags & 5U) == 0) {
        return;
      }
      fVar7 = (window->SizeFull).x;
      fVar6 = (window->WindowPadding).x;
      fVar6 = fVar6 + fVar6 + (window->ContentSize).x;
      uVar5 = -(uint)(fVar6 <= fVar7);
      fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)fVar6) - (window->Scroll).x;
      clip_dir = 0;
      if ((move_flags & 4U) != 0) {
        fVar6 = local_38.Max.y - local_38.Min.y;
        local_38.Min.y = local_38.Min.y - fVar6;
        local_38.Max.y = local_38.Max.y - fVar6;
        clip_dir = 2;
      }
      local_38.Max.x = fVar7;
      local_38.Min.x = fVar7;
      bVar4 = false;
      NavMoveRequestForward(0,clip_dir,&local_38,move_flags);
      iVar3 = pIVar1->NavMoveDir;
    }
    if (!(bool)(iVar3 != 1 | bVar4)) {
      fVar7 = (window->Scroll).x;
      fVar2 = local_38.Max.y;
      local_38.Max = (ImVec2)(CONCAT44(local_38.Max.y,fVar7) ^ 0x80000000);
      fVar6 = local_38.Min.y;
      local_38.Min = (ImVec2)(CONCAT44(local_38.Min.y,fVar7) ^ 0x80000000);
      if ((move_flags & 4U) != 0) {
        fVar7 = fVar2 - fVar6;
        local_38.Min.y = fVar6 + fVar7;
        local_38.Max.y = fVar7 + fVar2;
        clip_dir = 3;
      }
      NavMoveRequestForward(1,clip_dir,&local_38,move_flags);
      iVar3 = pIVar1->NavMoveDir;
    }
    if (((move_flags & 10U) != 0) && (iVar3 == 2)) {
      fVar7 = (window->SizeFull).y;
      fVar6 = (window->WindowPadding).y;
      fVar6 = fVar6 + fVar6 + (window->ContentSize).y;
      uVar5 = -(uint)(fVar6 <= fVar7);
      fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)fVar6) - (window->Scroll).y;
      if ((move_flags & 8U) != 0) {
        fVar6 = local_38.Max.x - local_38.Min.x;
        local_38.Min.x = local_38.Min.x - fVar6;
        local_38.Max.x = local_38.Max.x - fVar6;
        clip_dir = 0;
      }
      local_38.Max.y = fVar7;
      local_38.Min.y = fVar7;
      NavMoveRequestForward(2,clip_dir,&local_38,move_flags);
      iVar3 = pIVar1->NavMoveDir;
    }
    if (((move_flags & 10U) != 0) && (iVar3 == 3)) {
      fVar7 = (window->Scroll).y;
      fVar2 = local_38.Max.x;
      local_38.Max = (ImVec2)(CONCAT44(fVar7,local_38.Max.x) ^ 0x8000000000000000);
      fVar6 = local_38.Min.x;
      local_38.Min = (ImVec2)(CONCAT44(fVar7,local_38.Min.x) ^ 0x8000000000000000);
      if ((move_flags & 8U) != 0) {
        fVar7 = fVar2 - fVar6;
        local_38.Min.x = fVar6 + fVar7;
        local_38.Max.x = fVar7 + fVar2;
        clip_dir = 1;
      }
      NavMoveRequestForward(3,clip_dir,&local_38,move_flags);
    }
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->ContentSize.x + window->WindowPadding.x * 2.0f) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->ContentSize.y + window->WindowPadding.y * 2.0f) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}